

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr.cpp
# Opt level: O2

void embree::storeEXR(Ref<embree::Image> *img,FileName *fileName)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  runtime_error *this;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  Image *pIVar7;
  ulong uVar8;
  size_t x;
  ulong uVar9;
  char *err;
  string *local_90;
  Color4 c;
  vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_> rgb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = (string *)fileName;
  std::vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>::vector
            (&rgb,img->ptr->height * img->ptr->width,(allocator_type *)&c);
  pIVar7 = img->ptr;
  lVar6 = 0;
  for (uVar8 = 0; uVar9 = pIVar7->height, uVar8 < uVar9; uVar8 = uVar8 + 1) {
    lVar5 = 8;
    for (uVar9 = 0; uVar9 < pIVar7->width; uVar9 = uVar9 + 1) {
      (*(pIVar7->super_RefCount)._vptr_RefCount[4])((allocator_type *)&c,pIVar7,uVar9,uVar8);
      lVar3 = img->ptr->width * lVar6;
      *(undefined8 *)
       ((long)rgb.super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar5 + -8 + lVar3) = c.field_0._0_8_;
      *(float *)((long)&(rgb.
                         super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->r + lVar5 + lVar3) =
           c.field_0.m128[2];
      pIVar7 = img->ptr;
      lVar5 = lVar5 + 0xc;
    }
    lVar6 = lVar6 + 0xc;
  }
  err = (char *)0x0;
  sVar1 = pIVar7->width;
  std::__cxx11::string::string((string *)&c,local_90);
  iVar2 = SaveEXR(&(rgb.
                    super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->r,(int)sVar1,(int)uVar9,3,0,
                  (char *)c.field_0._0_8_,&err);
  std::__cxx11::string::~string((string *)&c);
  if (iVar2 == 0) {
    std::_Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>::~_Vector_base
              (&rgb.super__Vector_base<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>);
    return;
  }
  if (err != (char *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"ERR: ");
    std::operator<<(poVar4,err);
    free(err);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_50,local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                 "Could not save image ",&local_50);
  std::runtime_error::runtime_error(this,(string *)&c);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void storeEXR(const Ref<Image>& img, const FileName& fileName)
  {
    std::vector<Col3f> rgb(img->width * img->height);
    for (size_t y=0; y<img->height; ++y) {
        for (size_t x=0; x<img->width; ++x) {
            Color4 c = img->get(x, y);
            rgb[y * img->width + x] = Col3f(c.r, c.g, c.b);
        }
    }
    const char* err = NULL;
    int ret = SaveEXR((float*)rgb.data(), img->width, img->height, 3, 0, fileName.str().c_str(), &err);
    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        std::cerr << "ERR: " << err;
        FreeEXRErrorMessage(err);
      }
      THROW_RUNTIME_ERROR("Could not save image " + fileName.str())
    }
  }